

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

string * __thiscall
Json::valueToString_abi_cxx11_(string *__return_storage_ptr__,Json *this,LargestUInt value)

{
  bool bVar1;
  byte *pbVar2;
  UIntToStringBuffer buffer;
  allocator local_29;
  byte local_28 [23];
  byte local_11 [9];
  
  pbVar2 = local_11 + 1;
  local_11[1] = 0;
  do {
    pbVar2[-1] = (char)this + (char)(Json *)((ulong)this / 10) * -10 | 0x30;
    pbVar2 = pbVar2 + -1;
    bVar1 = (Json *)0x9 < this;
    this = (Json *)((ulong)this / 10);
  } while (bVar1);
  if (local_28 <= pbVar2) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)pbVar2,&local_29);
    return __return_storage_ptr__;
  }
  __assert_fail("current >= buffer",
                "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/lib_json/json_writer.cpp"
                ,0x54,"std::string Json::valueToString(LargestUInt)");
}

Assistant:

std::string valueToString(LargestUInt value) {
  UIntToStringBuffer buffer;
  char* current = buffer + sizeof(buffer);
  uintToString(value, current);
  assert(current >= buffer);
  return current;
}